

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_parameter_list(ParserState *parser,LuaSymbolList **list)

{
  LexerState *ls_00;
  _Bool _Var1;
  int iVar2;
  LuaSymbol *symbol_00;
  bool bVar3;
  LuaSymbol *symbol;
  _Bool is_vararg;
  LexerState *ls;
  LuaSymbolList **list_local;
  ParserState *parser_local;
  
  ls_00 = parser->ls;
  _Var1 = false;
  if ((ls_00->t).token != 0x29) {
    do {
      iVar2 = (ls_00->t).token;
      if (iVar2 == 0x11d) {
        raviX_next(ls_00);
        _Var1 = true;
      }
      else if (iVar2 == 0x12f) {
        symbol_00 = parse_local_variable_declaration(parser);
        add_parameter_to_current_function(parser,list,symbol_00);
      }
      else {
        raviX_syntaxerror(ls_00,"<name> or \'...\' expected");
      }
      bVar3 = false;
      if (_Var1 == false) {
        iVar2 = testnext(ls_00,0x2c);
        bVar3 = iVar2 != 0;
      }
    } while (bVar3);
  }
  return _Var1;
}

Assistant:

static bool parse_parameter_list(ParserState *parser, LuaSymbolList **list)
{
	LexerState *ls = parser->ls;
	/* parlist -> [ param { ',' param } ] */
	bool is_vararg = false;
	if (ls->t.token != ')') { /* is 'parlist' not empty? */
		do {
			switch (ls->t.token) {
			case TOK_NAME: { /* param -> NAME */
					 /* RAVI change - add type */
				LuaSymbol *symbol = parse_local_variable_declaration(parser);
				add_parameter_to_current_function(parser, list, symbol);
				break;
			}
			case TOK_DOTS: { /* param -> '...' */
				raviX_next(ls);
				is_vararg = true; /* declared vararg */
				break;
			}
			default:
				raviX_syntaxerror(ls, "<name> or '...' expected");
			}
		} while (!is_vararg && testnext(ls, ','));
	}
	return is_vararg;
}